

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O3

void Dch_ManResimulateSolved_rec(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = p->pAigTotal->nTravIds;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    if (((uint)*(ulong *)&pObj->field_0x18 & 7) == 2) {
      if (((ulong)(pObj->field_5).pData & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                      ,0x79,"void Dch_ManResimulateSolved_rec(Dch_Man_t *, Aig_Obj_t *)");
      }
      uVar2 = p->pSatVars[*(int *)((long)(pObj->field_5).pData + 0x24)];
      if ((ulong)uVar2 == 0) {
        uVar3 = 0;
      }
      else {
        if (((int)uVar2 < 0) || (p->pSat->size <= (int)uVar2)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar3 = (ulong)(p->pSat->model[uVar2] == 1) << 5;
      }
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffda | uVar3;
    }
    else {
      Dch_ManResimulateSolved_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Dch_ManResimulateSolved_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      *(ulong *)&pObj->field_0x18 =
           *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf |
           (ulong)((((uint)pObj->pFanin1 ^
                    *(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x18) >> 5) &
                    ((uint)pObj->pFanin0 ^
                    *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x18) >> 5) & 1) << 5);
      if (0 < p->pSatVars[*(int *)(((ulong)(pObj->field_5).pData & 0xfffffffffffffffe) + 0x24)]) {
        p->nConeThis = p->nConeThis + 1;
      }
    }
  }
  return;
}

Assistant:

void Dch_ManResimulateSolved_rec( Dch_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p->pAigTotal, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p->pAigTotal, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Aig_Obj_t * pObjFraig;
        int nVarNum;
        pObjFraig = Dch_ObjFraig( pObj );
        assert( !Aig_IsComplement(pObjFraig) );
        nVarNum = Dch_ObjSatNum( p, pObjFraig );
        // get the value from the SAT solver
        // (account for the fact that some vars may be minimized away)
        pObj->fMarkB = !nVarNum? 0 : sat_solver_var_value( p->pSat, nVarNum );
//        pObj->fMarkB = !nVarNum? Aig_ManRandom(0) & 1 : sat_solver_var_value( p->pSat, nVarNum );
        return;
    }
    Dch_ManResimulateSolved_rec( p, Aig_ObjFanin0(pObj) );
    Dch_ManResimulateSolved_rec( p, Aig_ObjFanin1(pObj) );
    pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                 & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
    // count the cone size
    if ( Dch_ObjSatNum( p, Aig_Regular(Dch_ObjFraig(pObj)) ) > 0 )
        p->nConeThis++;
}